

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

char * __thiscall Catch::StringRef::c_str(StringRef *this)

{
  bool bVar1;
  StringRef *in_RDI;
  ReusableStringStream *this_00;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  NonCopyable in_stack_ffffffffffffffc0;
  ReusableStringStream *in_stack_ffffffffffffffd0;
  
  bVar1 = isNullTerminated(in_RDI);
  if (!bVar1) {
    this_00 = (ReusableStringStream *)&stack0xffffffffffffffc0;
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffd0);
    ReusableStringStream::operator<<(in_stack_ffffffffffffffa0,(char (*) [60])this_00);
    ReusableStringStream::str_abi_cxx11_(this_00);
    throw_domain_error((string *)in_stack_ffffffffffffffc0._vptr_NonCopyable);
  }
  return in_RDI->m_start;
}

Assistant:

auto StringRef::c_str() const -> char const* {
        CATCH_ENFORCE(isNullTerminated(), "Called StringRef::c_str() on a non-null-terminated instance");
        return m_start;
    }